

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd3D.c
# Opt level: O3

void init_fdtd_3D_medium(fdtd3D *fdtd,init_medium_fun_3D permeability_invR,
                        init_medium_fun_3D permittivity_invR,void *user)

{
  long lVar1;
  ulong uVar2;
  void *pvVar3;
  ulong uVar4;
  uintmax_t uVar5;
  ulong uVar6;
  uintmax_t uVar7;
  long lVar8;
  void *pvVar9;
  void *pvVar10;
  ulong uVar11;
  double dVar12;
  float_type fVar13;
  double dVar14;
  double dVar15;
  void *local_88;
  
  uVar5 = fdtd->sizeX;
  if (uVar5 != 0) {
    uVar2 = fdtd->sizeZ;
    uVar7 = fdtd->sizeY;
    local_88 = fdtd->permeability_inv;
    pvVar10 = fdtd->permittivity_inv;
    dVar12 = 0.0;
    uVar4 = 0;
    lVar1 = uVar2 * 8;
    lVar8 = uVar2 * uVar7 * 8;
    uVar11 = uVar7;
    do {
      if (uVar7 == 0) {
        uVar7 = 0;
      }
      else {
        dVar15 = 0.0;
        uVar6 = 0;
        pvVar3 = local_88;
        uVar7 = uVar11;
        pvVar9 = pvVar10;
        do {
          if (uVar2 == 0) {
            uVar2 = 0;
          }
          else {
            dVar14 = 0.0;
            uVar11 = 0;
            do {
              fVar13 = (*permeability_invR)(dVar12,dVar15,dVar14,user);
              *(double *)((long)pvVar3 + uVar11 * 8) = 1.0 / (fVar13 * 1.2566370614359173e-06);
              fVar13 = (*permittivity_invR)(dVar12,dVar15,dVar14,user);
              *(double *)((long)pvVar9 + uVar11 * 8) = 1.0 / (fVar13 * 8.85418781762039e-12);
              uVar11 = uVar11 + 1;
              dVar14 = dVar14 + fdtd->dz;
              uVar2 = fdtd->sizeZ;
            } while (uVar11 < uVar2);
            uVar7 = fdtd->sizeY;
          }
          dVar15 = dVar15 + fdtd->dy;
          uVar6 = uVar6 + 1;
          pvVar9 = (void *)((long)pvVar9 + lVar1);
          pvVar3 = (void *)((long)pvVar3 + lVar1);
        } while (uVar6 < uVar7);
        uVar5 = fdtd->sizeX;
        uVar11 = uVar7;
      }
      dVar12 = dVar12 + fdtd->dx;
      uVar4 = uVar4 + 1;
      local_88 = (void *)((long)local_88 + lVar8);
      pvVar10 = (void *)((long)pvVar10 + lVar8);
    } while (uVar4 < uVar5);
  }
  return;
}

Assistant:

void init_fdtd_3D_medium(struct fdtd3D *fdtd,
                         init_medium_fun_3D permeability_invR,
                         init_medium_fun_3D permittivity_invR, void *user) {
  VLA_3D_definition(float_type, fdtd->sizeX, fdtd->sizeY, fdtd->sizeZ,
                    permittivity_inv, fdtd->permittivity_inv);
  VLA_3D_definition(float_type, fdtd->sizeX, fdtd->sizeY, fdtd->sizeZ,
                    permeability_inv, fdtd->permeability_inv);
  float_type posX = float_cst(0.);
  for (uintmax_t i = 0; i < fdtd->sizeX; ++i, posX += fdtd->dx) {
    float_type posY = float_cst(0.);
    for (uintmax_t j = 0; j < fdtd->sizeY; ++j, posY += fdtd->dy) {
      float_type posZ = float_cst(0.);
      for (uintmax_t k = 0; k < fdtd->sizeZ; ++k, posZ += fdtd->dz) {
        permeability_inv[i][j][k] =
            float_cst(1.) / (permeability_invR(posX, posY, posZ, user) * mu0);
        permittivity_inv[i][j][k] =
            float_cst(1.) / (permittivity_invR(posX, posY, posZ, user) * eps0);
      }
    }
  }
}